

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O2

void chrono::
     _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>*>,chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>
               (list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                *contactlist,
               _List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>
               *lastcontact,int *n_added,ChContactContainer *container,ChContactable_1vars<6> *objA,
               ChContactable_1vars<6> *objB,ChCollisionInfo *cinfo,ChMaterialCompositeSMC *cmat)

{
  ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_> *this;
  ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_> *local_38;
  
  if (lastcontact->_M_node == (_List_node_base *)contactlist) {
    this = (ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_> *)
           ::operator_new(0xe0);
    ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::ChContactSMC
              (this,container,objA,objB,cinfo,cmat);
    local_38 = this;
    std::__cxx11::
    list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
    ::push_back(contactlist,&local_38);
    lastcontact->_M_node = (_List_node_base *)contactlist;
  }
  else {
    ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::Reset
              ((ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_> *)
               lastcontact->_M_node[1]._M_next,objA,objB,cinfo,cmat);
    lastcontact->_M_node = lastcontact->_M_node->_M_next;
  }
  *n_added = *n_added + 1;
  return;
}

Assistant:

void _OptimalContactInsert(std::list<Tcont*>& contactlist,           // contact list
                           Titer& lastcontact,                       // last contact acquired
                           int& n_added,                             // number of contacts inserted
                           ChContactContainer* container,            // contact container
                           Ta* objA,                                 // collidable object A
                           Tb* objB,                                 // collidable object B
                           const collision::ChCollisionInfo& cinfo,  // collision information
                           const ChMaterialCompositeSMC& cmat        // composite material
) {
    if (lastcontact != contactlist.end()) {
        // reuse old contacts
        (*lastcontact)->Reset(objA, objB, cinfo, cmat);
        lastcontact++;
    } else {
        // add new contact
        Tcont* mc = new Tcont(container, objA, objB, cinfo, cmat);
        contactlist.push_back(mc);
        lastcontact = contactlist.end();
    }
    n_added++;
}